

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O0

rfc5444_result cb_blocktlv_address(rfc5444_reader_tlvblock_context *ctx)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  int oi;
  uint8_t ai;
  uint8_t *addr;
  rfc5444_reader_tlvblock_context *ctx_local;
  
  bVar2 = (ctx->addr)._addr[3] - 1;
  iVar3 = ctx->consumer->order + -1;
  printf("%s: address %d blocktlv (order %d): %d\n","cb_blocktlv_address",(ulong)(bVar2 + 1),
         (ulong)(uint)ctx->consumer->order,(ulong)(uint)callback_index);
  iVar1 = callback_index + 1;
  idxcb_blocktlv_address[iVar3][bVar2] = callback_index;
  callback_index = iVar1;
  bVar4 = consumer_entries[0].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  gottlv_blocktlv_address[iVar3][bVar2][0] = bVar4;
  if (bVar4) {
    consumer_entries[0].drop = (_Bool)(droptlv_blocktlv_address[iVar3][bVar2][0] & 1);
  }
  bVar4 = consumer_entries[1].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  *(bool *)((long)iVar3 * 4 + 0x11a641 + (ulong)bVar2 * 2) = bVar4;
  if (bVar4) {
    consumer_entries[1].drop = (_Bool)(*(byte *)((long)iVar3 * 4 + 0x11a649 + (ulong)bVar2 * 2) & 1)
    ;
  }
  return result_blockcb_address[iVar3][bVar2];
}

Assistant:

static enum rfc5444_result
cb_blocktlv_address(struct rfc5444_reader_tlvblock_context *ctx) {
  const uint8_t *addr = netaddr_get_binptr(&ctx->addr);
  const uint8_t ai = addr[3] - 1;
  int oi = ctx->consumer->order - 1;

#ifdef PRINT_CB
  printf("%s: address %d blocktlv (order %d): %d\n",
      __func__, ai+1, ctx->consumer->order, callback_index);
#endif
  idxcb_blocktlv_address[oi][ai] = callback_index++;

  if ((gottlv_blocktlv_address[oi][ai][0] = consumer_entries[0].tlv != NULL)) {
    consumer_entries[0].drop = droptlv_blocktlv_address[oi][ai][0];
  }
  if ((gottlv_blocktlv_address[oi][ai][1] = consumer_entries[1].tlv != NULL)) {
    consumer_entries[1].drop = droptlv_blocktlv_address[oi][ai][1];
  }

  return result_blockcb_address[oi][ai];
}